

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

QWindow * __thiscall QAccessibleWidget::window(QAccessibleWidget *this)

{
  QWidget *this_00;
  QWidget *nativeParent;
  QWindow *result;
  QWidget *w;
  QWidget *in_stack_ffffffffffffffe0;
  QWindow *local_18;
  
  widget((QAccessibleWidget *)0x7dd137);
  local_18 = QWidget::windowHandle(in_stack_ffffffffffffffe0);
  if ((local_18 == (QWindow *)0x0) &&
     (this_00 = QWidget::nativeParentWidget(in_stack_ffffffffffffffe0), this_00 != (QWidget *)0x0))
  {
    local_18 = QWidget::windowHandle(this_00);
  }
  return local_18;
}

Assistant:

QWindow *QAccessibleWidget::window() const
{
    const QWidget *w = widget();
    Q_ASSERT(w);
    QWindow *result = w->windowHandle();
    if (!result) {
        if (const QWidget *nativeParent = w->nativeParentWidget())
            result = nativeParent->windowHandle();
    }
    return result;
}